

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O0

void __thiscall deci::stack_t::stack_t(stack_t *this,stack_t *move)

{
  int iVar1;
  value_t *pvVar2;
  undefined4 extraout_var;
  stack_t *move_local;
  stack_t *this_local;
  
  std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::vector
            (&this->storage,&move->storage);
  dictionary_t::dictionary_t(&this->context,&move->context);
  this->result = move->result;
  pvVar2 = nothing_t::Instance();
  iVar1 = (*pvVar2->_vptr_value_t[2])();
  move->result = (value_t *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

stack_t::stack_t(stack_t&& move)
    : storage(std::move(move.storage))
    , context(std::move(move.context)) 
    , result(move.result)
  {
      move.result = nothing_t::Instance().Copy();
  }